

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O2

void swrenderer::R_ClearPlanes(bool fullclear)

{
  undefined8 *puVar1;
  undefined2 uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  visplane_t *vis;
  undefined7 in_register_00000039;
  
  if ((int)CONCAT71(in_register_00000039,fullclear) == 0) {
    for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 1) {
      puVar6 = &visplanes + lVar3;
      while (puVar7 = puVar6, puVar1 = (undefined8 *)*puVar7, puVar1 != (undefined8 *)0x0) {
        puVar6 = puVar1;
        if (-1 < *(int *)(puVar1 + 0x11)) {
          *(undefined8 **)freehead = puVar1;
          *puVar7 = *puVar1;
          *puVar1 = 0;
          puVar6 = puVar7;
          freehead = (undefined *)puVar1;
        }
      }
    }
  }
  else {
    puVar6 = (undefined8 *)freehead;
    for (lVar3 = 0; uVar2 = (undefined2)viewheight, lVar3 != 0x81; lVar3 = lVar3 + 1) {
      *puVar6 = (&visplanes)[lVar3];
      (&visplanes)[lVar3] = 0;
      puVar1 = puVar6;
      puVar7 = (undefined8 *)freehead;
      do {
        freehead = (undefined *)puVar7;
        puVar6 = puVar1;
        puVar1 = (undefined8 *)*puVar6;
        puVar7 = puVar1;
      } while (puVar1 != (undefined8 *)0x0);
    }
    uVar4 = (ulong)(uint)viewwidth;
    for (lVar3 = 0; uVar4 * 2 != lVar3; lVar3 = lVar3 + 2) {
      *(undefined2 *)((long)&floorclip + lVar3) = uVar2;
    }
    if (((screen->Accel2D != false) ||
        (iVar5 = ConBottom - viewwindowy, iVar5 == 0 || ConBottom < viewwindowy)) ||
       (bRenderingToCanvas != '\0')) {
      iVar5 = 0;
    }
    for (lVar3 = 0; uVar4 * 2 != lVar3; lVar3 = lVar3 + 2) {
      *(short *)((long)&ceilingclip + lVar3) = (short)iVar5;
    }
    lastopening = 0;
  }
  return;
}

Assistant:

void R_ClearPlanes (bool fullclear)
{
	int i;

	// Don't clear fake planes if not doing a full clear.
	if (!fullclear)
	{
		for (i = 0; i <= MAXVISPLANES-1; i++)	// new code -- killough
		{
			for (visplane_t **probe = &visplanes[i]; *probe != NULL; )
			{
				if ((*probe)->sky < 0)
				{ // fake: move past it
					probe = &(*probe)->next;
				}
				else
				{ // not fake: move to freelist
					visplane_t *vis = *probe;
					*freehead = vis;
					*probe = vis->next;
					vis->next = NULL;
					freehead = &vis->next;
				}
			}
		}
	}
	else
	{
		for (i = 0; i <= MAXVISPLANES; i++)	// new code -- killough
		{
			for (*freehead = visplanes[i], visplanes[i] = NULL; *freehead; )
			{
				freehead = &(*freehead)->next;
			}
		}

		// opening / clipping determination
		fillshort (floorclip, viewwidth, viewheight);
		// [RH] clip ceiling to console bottom
		fillshort (ceilingclip, viewwidth,
			!screen->Accel2D && ConBottom > viewwindowy && !bRenderingToCanvas
			? (ConBottom - viewwindowy) : 0);

		lastopening = 0;
	}
}